

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void read_bytes<int,int>(void *ptr,size_t n_els,FILE **in,
                        vector<char,_std::allocator<char>_> *buffer,bool diff_endian)

{
  byte bVar1;
  void *in_RCX;
  byte in_R8B;
  size_t in_stack_ffffffffffffffc8;
  FILE **in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  
  bVar1 = in_R8B & 1;
  read_bytes<int>(in_RCX,CONCAT17(in_R8B,in_stack_ffffffffffffffd8) & 0x1ffffffffffffff,
                  in_stack_ffffffffffffffd0);
  if ((bVar1 & 1) != 0) {
    swap_endianness<int>((int *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void read_bytes(void *ptr, const size_t n_els, FILE *&in, std::vector<char> &buffer, const bool diff_endian)
{
    if (std::is_same<dtype, saved_type>::value)
    {
        read_bytes<dtype>(ptr, n_els, in);
        if (unlikely(diff_endian)) swap_endianness((dtype*)ptr, n_els);
        return;
    }
    if (n_els == 0) return;
    if (unlikely(feof(in))) throw_feoferr();
    if (unlikely(buffer.size() < n_els * sizeof(saved_type)))
        buffer.resize((size_t)2 * n_els * sizeof(saved_type));
    size_t n_read = fread(buffer.data(), sizeof(saved_type), n_els, in);
    if (unlikely(n_read != n_els || ferror(in))) throw_ferror(in);

    if (unlikely(diff_endian)) swap_endianness((saved_type*)buffer.data(), n_els);
    convert_dtype<dtype, saved_type>(ptr, buffer, n_els);
}